

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::DrawMainBar(DStrifeStatusBar *this)

{
  FImageCollection *this_00;
  FTextureID texnum;
  player_t *ppVar1;
  APlayerPawn *this_01;
  DFrameBuffer *this_02;
  int iVar2;
  FTexture *pFVar3;
  ABasicArmor *pAVar4;
  PClassActor *type;
  AInventory *pAVar5;
  AInventory *pAVar6;
  int iVar7;
  uint uVar8;
  AAmmo *ammo1;
  int ammocount2;
  int ammocount1;
  AAmmo *ammo2;
  
  if ((this->CurrentPop != 0) && (this->PopHeight < 0)) {
    iVar2 = (this->super_DBaseStatusBar).ST_Y + -8;
    if ((this->super_DBaseStatusBar).Scaled == true) {
      iVar2 = (iVar2 * (screen->super_DSimpleCanvas).super_DCanvas.Height) / 200;
    }
    DrawPopScreen(this,iVar2);
  }
  this_00 = &this->Images;
  pFVar3 = FImageCollection::operator[](this_00,2);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar3,0,0,(FRemapTable *)0x0);
  pFVar3 = FImageCollection::operator[](this_00,3);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar3,0,-8,(FRemapTable *)0x0);
  DrINumber(this,((this->super_DBaseStatusBar).CPlayer)->health,0x4f,-6,8);
  ppVar1 = (this->super_DBaseStatusBar).CPlayer;
  if ((ppVar1->cheats & 2) == 0) {
    FHealthBar::SetVial(&this->HealthBar,ppVar1->health);
  }
  else if ((this->HealthBar).VialLevel != 999) {
    (this->HealthBar).VialLevel = 999;
    (this->HealthBar).NeedRefresh = true;
  }
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,4,(FRemapTable *)0x0
            );
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,7,(FRemapTable *)0x0
            );
  pAVar4 = AActor::FindInventory<ABasicArmor>
                     (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
  if ((pAVar4 != (ABasicArmor *)0x0) && (0 < (pAVar4->super_AArmor).super_AInventory.Amount)) {
    pFVar3 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(pAVar4->super_AArmor).super_AInventory.Icon.texnum,
                        false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar3,2,9,(FRemapTable *)0x0);
    DrINumber(this,(pAVar4->super_AArmor).super_AInventory.Amount,0x1b,0x17,0x13);
  }
  DBaseStatusBar::GetCurrentAmmo(&this->super_DBaseStatusBar,&ammo1,&ammo2,&ammocount1,&ammocount2);
  if (ammo1 != (AAmmo *)0x0) {
    DrINumber(this,(ammo1->super_AInventory).Amount,0x137,-6,8);
    pFVar3 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(ammo1->super_AInventory).Icon.texnum,false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar3,0x122,0xd,(FRemapTable *)0x0);
  }
  this_01 = ((this->super_DBaseStatusBar).CPlayer)->mo;
  type = PClass::FindActor(NAME_Sigil);
  iVar2 = 0;
  pAVar5 = AActor::FindInventory(&this_01->super_AActor,type,false);
  if (pAVar5 != (AInventory *)0x0) {
    pFVar3 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar5->Icon).texnum,false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar3,0xfd,7,(FRemapTable *)0x0);
  }
  ((this->super_DBaseStatusBar).CPlayer)->inventorytics = 0;
  pAVar5 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
  (((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar5;
  pAVar5 = GC::ReadBarrier<AInventory>
                     ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
  for (uVar8 = 0; (pAVar5 != (AInventory *)0x0 && (uVar8 < 6)); uVar8 = uVar8 + 1) {
    pAVar6 = GC::ReadBarrier<AInventory>
                       ((AInventory **)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
    this_02 = screen;
    if (pAVar5 == pAVar6) {
      pFVar3 = FImageCollection::operator[](this_00,this->CursorImage);
      DCanvas::DrawTexture
                ((DCanvas *)this_02,pFVar3,
                 (double)(*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + iVar2 +
                         0x2a),(double)((this->super_DBaseStatusBar).ST_Y + 0xc),0x40001392,
                 1.0 - this->ItemFlash,(ulong)(this->super_DBaseStatusBar).Scaled,0x4000138c,0);
    }
    texnum.texnum = (pAVar5->Icon).texnum;
    iVar7 = iVar2;
    if (0 < texnum.texnum) {
      pFVar3 = FTextureManager::operator()(&TexMan,texnum,false);
      iVar7 = uVar8 * 0x23;
      DBaseStatusBar::DrawDimImage
                (&this->super_DBaseStatusBar,pFVar3,iVar2 + 0x30,0xe,pAVar5->Amount < 1);
    }
    DrINumber(this,pAVar5->Amount,iVar7 + 0x4a,0x17,0x13);
    pAVar5 = AInventory::NextInv(pAVar5);
    iVar2 = iVar2 + 0x23;
  }
  return;
}

Assistant:

void DrawMainBar ()
	{
		AInventory *item;
		int i;

		// Pop screen (log, keys, and status)
		if (CurrentPop != POP_None && PopHeight < 0)
		{
			DrawPopScreen (Scaled ? (ST_Y - 8) * screen->GetHeight() / 200 : ST_Y - 8);
		}

		DrawImage (Images[imgINVBACK], 0, 0);
		DrawImage (Images[imgINVTOP], 0, -8);

		// Health
		DrINumber (CPlayer->health, 79, -6, imgFONG0);
		if (CPlayer->cheats & CF_GODMODE)
		{
			HealthBar.SetVial (999);
		}
		else
		{
			HealthBar.SetVial (CPlayer->health);
		}
		DrawImage (&HealthBar, 49, 4);
		DrawImage (&HealthBar, 49, 7);

		// Armor
		item = CPlayer->mo->FindInventory<ABasicArmor>();
		if (item != NULL && item->Amount > 0)
		{
			DrawImage (TexMan(item->Icon), 2, 9);
			DrINumber (item->Amount, 27, 23, imgFONY0);
		}

		// Ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			DrINumber (ammo1->Amount, 311, -6, imgFONG0);
			DrawImage (TexMan(ammo1->Icon), 290, 13);
			if (ammo2 != NULL)
			{
/*				int y = MIN (-5 - BigHeight, -5 - TexMan(ammo1->Icon)->GetHeight());
				screen->DrawTexture (TexMan(ammo2->Icon), -14, y,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
				DrBNumberOuterFont (ammo2->Amount, -67, y - BigHeight);
*/			}
		}

		// Sigil
		item = CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
		if (item != NULL)
		{
			DrawImage (TexMan(item->Icon), 253, 7);
		}

		// Inventory
		CPlayer->inventorytics = 0;
		CPlayer->mo->InvFirst = ValidateInvFirst (6);
		for (item = CPlayer->mo->InvFirst, i = 0; item != NULL && i < 6; item = item->NextInv(), ++i)
		{
			if (item == CPlayer->mo->InvSel)
			{
				screen->DrawTexture (Images[CursorImage],
					42 + 35*i + ST_X, 12 + ST_Y,
					DTA_Bottom320x200, Scaled,
					DTA_AlphaF, 1. - ItemFlash,
					TAG_DONE);
			}
			if (item->Icon.isValid())
			{
				DrawDimImage (TexMan(item->Icon), 48 + 35*i, 14, item->Amount <= 0);
			}
			DrINumber (item->Amount, 74 + 35*i, 23, imgFONY0);
		}
	}